

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-caster.h
# Opt level: O0

void dynamicgraph::signal_io<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::disp
               (matrix_type *value,ostream *os)

{
  ostream *s;
  int iVar1;
  WithFormat<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_210;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  matrix_type *value_local;
  
  local_18 = os;
  os_local = (ostream *)value;
  if (signal_io<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      disp(Eigen::Matrix<double,int,int,int,int,int>const&,std::ostream&)::row_format == '\0') {
    iVar1 = __cxa_guard_acquire(&signal_io<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                                 disp(Eigen::Matrix<double,int,int,int,int,int>const&,std::ostream&)
                                 ::row_format);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38," ",&local_39);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70," ",&local_71);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
      Eigen::IOFormat::IOFormat
                (&disp::row_format,-1,1,&local_38,&local_70,&local_98,&local_c0,&local_e8,&local_110
                 ,' ');
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
      __cxa_atexit(Eigen::IOFormat::~IOFormat,&disp::row_format,&__dso_handle);
      __cxa_guard_release(&signal_io<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                           disp(Eigen::Matrix<double,int,int,int,int,int>const&,std::ostream&)::
                           row_format);
    }
  }
  s = local_18;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::format
            (&local_210,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)os_local,
             &disp::row_format);
  Eigen::operator<<(s,&local_210);
  Eigen::WithFormat<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~WithFormat(&local_210);
  return;
}

Assistant:

inline static void disp(const matrix_type &value, std::ostream &os) {
    static const Eigen::IOFormat row_format(
        Eigen::StreamPrecision, Eigen::DontAlignCols, " ", " ", "", "", "", "");
    os << value.format(row_format);
  }